

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O2

void __thiscall BMRS<TTA>::InitCompressedData(BMRS<TTA> *this,Data_Compressed *data_compressed)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Mat1b *pMVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t *puVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar6->field_0xc;
  puVar16 = data_compressed->bits;
  iVar5 = data_compressed->data_width;
  iVar11 = (int)((long)iVar4 % 0x40);
  uVar8 = 0;
  uVar17 = (ulong)(uint)(iVar4 >> 6);
  if (iVar4 >> 6 < 1) {
    uVar17 = uVar8;
  }
  uVar12 = (long)iVar4 % 0x40 & 0xffffffff;
  if (iVar11 < 1) {
    uVar12 = uVar8;
  }
  uVar14 = (ulong)*(uint *)&pMVar6->field_0x8;
  if ((int)*(uint *)&pMVar6->field_0x8 < 1) {
    uVar14 = uVar8;
  }
  for (; uVar8 != uVar14; uVar8 = uVar8 + 1) {
    lVar7 = *(long *)&pMVar6->field_0x10;
    lVar9 = **(long **)&pMVar6->field_0x48 * uVar8;
    lVar1 = lVar7 + lVar9;
    for (lVar18 = 0; uVar17 * 8 != lVar18; lVar18 = lVar18 + 8) {
      uVar13 = (ulong)(*(char *)(lVar1 + lVar18 * 8) != '\0');
      uVar10 = uVar13 + 2;
      if (*(char *)(lVar1 + 1 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 + 4;
      if (*(char *)(lVar1 + 2 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 + 8;
      if (*(char *)(lVar1 + 3 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x10;
      if (*(char *)(lVar1 + 4 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x20;
      if (*(char *)(lVar1 + 5 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x40;
      if (*(char *)(lVar1 + 6 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x80;
      if (*(char *)(lVar1 + 7 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x100;
      if (*(char *)(lVar1 + 8 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x200;
      if (*(char *)(lVar1 + 9 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x400;
      if (*(char *)(lVar1 + 10 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x800;
      if (*(char *)(lVar1 + 0xb + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x1000;
      if (*(char *)(lVar1 + 0xc + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x2000;
      if (*(char *)(lVar1 + 0xd + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x4000;
      if (*(char *)(lVar1 + 0xe + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x8000;
      if (*(char *)(lVar1 + 0xf + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x10000;
      if (*(char *)(lVar1 + 0x10 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x20000;
      if (*(char *)(lVar1 + 0x11 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x40000;
      if (*(char *)(lVar1 + 0x12 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x80000;
      if (*(char *)(lVar1 + 0x13 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x100000;
      if (*(char *)(lVar1 + 0x14 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x200000;
      if (*(char *)(lVar1 + 0x15 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x400000;
      if (*(char *)(lVar1 + 0x16 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x800000;
      if (*(char *)(lVar1 + 0x17 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x1000000;
      if (*(char *)(lVar1 + 0x18 + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x2000000;
      if (*(char *)(lVar1 + 0x19 + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x4000000;
      if (*(char *)(lVar1 + 0x1a + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x8000000;
      if (*(char *)(lVar1 + 0x1b + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x10000000;
      if (*(char *)(lVar1 + 0x1c + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x20000000;
      if (*(char *)(lVar1 + 0x1d + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x40000000;
      if (*(char *)(lVar1 + 0x1e + lVar18 * 8) == '\0') {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x80000000;
      if (*(char *)(lVar1 + 0x1f + lVar18 * 8) == '\0') {
        uVar10 = uVar13;
      }
      pcVar2 = (char *)(lVar1 + 0x20 + lVar18 * 8);
      pcVar3 = (char *)(lVar1 + 0x30 + lVar18 * 8);
      auVar19[0] = -(*pcVar2 == '\0');
      auVar19[1] = -(pcVar2[1] == '\0');
      auVar19[2] = -(pcVar2[2] == '\0');
      auVar19[3] = -(pcVar2[3] == '\0');
      auVar19[4] = -(pcVar2[4] == '\0');
      auVar19[5] = -(pcVar2[5] == '\0');
      auVar19[6] = -(pcVar2[6] == '\0');
      auVar19[7] = -(pcVar2[7] == '\0');
      auVar19[8] = -(pcVar2[8] == '\0');
      auVar19[9] = -(pcVar2[9] == '\0');
      auVar19[10] = -(pcVar2[10] == '\0');
      auVar19[0xb] = -(pcVar2[0xb] == '\0');
      auVar19[0xc] = -(pcVar2[0xc] == '\0');
      auVar19[0xd] = -(pcVar2[0xd] == '\0');
      auVar19[0xe] = -(pcVar2[0xe] == '\0');
      auVar19[0xf] = -(pcVar2[0xf] == '\0');
      auVar20[0] = -(*pcVar3 == '\0');
      auVar20[1] = -(pcVar3[1] == '\0');
      auVar20[2] = -(pcVar3[2] == '\0');
      auVar20[3] = -(pcVar3[3] == '\0');
      auVar20[4] = -(pcVar3[4] == '\0');
      auVar20[5] = -(pcVar3[5] == '\0');
      auVar20[6] = -(pcVar3[6] == '\0');
      auVar20[7] = -(pcVar3[7] == '\0');
      auVar20[8] = -(pcVar3[8] == '\0');
      auVar20[9] = -(pcVar3[9] == '\0');
      auVar20[10] = -(pcVar3[10] == '\0');
      auVar20[0xb] = -(pcVar3[0xb] == '\0');
      auVar20[0xc] = -(pcVar3[0xc] == '\0');
      auVar20[0xd] = -(pcVar3[0xd] == '\0');
      auVar20[0xe] = -(pcVar3[0xe] == '\0');
      auVar20[0xf] = -(pcVar3[0xf] == '\0');
      uVar13 = uVar10 | 0x100000000;
      if ((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x200000000;
      if ((auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x400000000;
      if ((auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x800000000;
      if ((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x1000000000;
      if ((auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x2000000000;
      if ((auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x4000000000;
      if ((auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x8000000000;
      if ((auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x10000000000;
      if ((auVar19 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x20000000000;
      if ((auVar19 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x40000000000;
      if ((auVar19 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x80000000000;
      if ((auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x100000000000;
      if ((auVar19 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x200000000000;
      if ((auVar19 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x400000000000;
      if ((auVar19 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x800000000000;
      if (pcVar2[0xf] == '\0') {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x1000000000000;
      if ((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x2000000000000;
      if ((auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x4000000000000;
      if ((auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x8000000000000;
      if ((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x10000000000000;
      if ((auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x20000000000000;
      if ((auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x40000000000000;
      if ((auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x80000000000000;
      if ((auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x100000000000000;
      if ((auVar20 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x200000000000000;
      if ((auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x400000000000000;
      if ((auVar20 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x800000000000000;
      if ((auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x1000000000000000;
      if ((auVar20 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x2000000000000000;
      if ((auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10 | 0x4000000000000000;
      if ((auVar20 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13 | 0x8000000000000000;
      if (pcVar3[0xf] == '\0') {
        uVar10 = uVar13;
      }
      *(ulong *)((long)puVar16 + lVar18) = uVar10;
    }
    uVar13 = 0;
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      uVar15 = 0;
      if (*(char *)(lVar7 + (iVar4 - iVar11) + lVar9 + uVar10) != '\0') {
        uVar15 = 1L << ((byte)uVar10 & 0x3f);
      }
      uVar13 = uVar13 | uVar15;
    }
    *(ulong *)((long)puVar16 + lVar18) = uVar13;
    puVar16 = puVar16 + iVar5;
  }
  return;
}

Assistant:

void InitCompressedData(Data_Compressed& data_compressed) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                uchar* base = source + (j << 6);
                uint64_t obits = 0;
                if (base[0]) obits |= 0x0000000000000001;
                if (base[1]) obits |= 0x0000000000000002;
                if (base[2]) obits |= 0x0000000000000004;
                if (base[3]) obits |= 0x0000000000000008;
                if (base[4]) obits |= 0x0000000000000010;
                if (base[5]) obits |= 0x0000000000000020;
                if (base[6]) obits |= 0x0000000000000040;
                if (base[7]) obits |= 0x0000000000000080;
                if (base[8]) obits |= 0x0000000000000100;
                if (base[9]) obits |= 0x0000000000000200;
                if (base[10]) obits |= 0x0000000000000400;
                if (base[11]) obits |= 0x0000000000000800;
                if (base[12]) obits |= 0x0000000000001000;
                if (base[13]) obits |= 0x0000000000002000;
                if (base[14]) obits |= 0x0000000000004000;
                if (base[15]) obits |= 0x0000000000008000;
                if (base[16]) obits |= 0x0000000000010000;
                if (base[17]) obits |= 0x0000000000020000;
                if (base[18]) obits |= 0x0000000000040000;
                if (base[19]) obits |= 0x0000000000080000;
                if (base[20]) obits |= 0x0000000000100000;
                if (base[21]) obits |= 0x0000000000200000;
                if (base[22]) obits |= 0x0000000000400000;
                if (base[23]) obits |= 0x0000000000800000;
                if (base[24]) obits |= 0x0000000001000000;
                if (base[25]) obits |= 0x0000000002000000;
                if (base[26]) obits |= 0x0000000004000000;
                if (base[27]) obits |= 0x0000000008000000;
                if (base[28]) obits |= 0x0000000010000000;
                if (base[29]) obits |= 0x0000000020000000;
                if (base[30]) obits |= 0x0000000040000000;
                if (base[31]) obits |= 0x0000000080000000;
                if (base[32]) obits |= 0x0000000100000000;
                if (base[33]) obits |= 0x0000000200000000;
                if (base[34]) obits |= 0x0000000400000000;
                if (base[35]) obits |= 0x0000000800000000;
                if (base[36]) obits |= 0x0000001000000000;
                if (base[37]) obits |= 0x0000002000000000;
                if (base[38]) obits |= 0x0000004000000000;
                if (base[39]) obits |= 0x0000008000000000;
                if (base[40]) obits |= 0x0000010000000000;
                if (base[41]) obits |= 0x0000020000000000;
                if (base[42]) obits |= 0x0000040000000000;
                if (base[43]) obits |= 0x0000080000000000;
                if (base[44]) obits |= 0x0000100000000000;
                if (base[45]) obits |= 0x0000200000000000;
                if (base[46]) obits |= 0x0000400000000000;
                if (base[47]) obits |= 0x0000800000000000;
                if (base[48]) obits |= 0x0001000000000000;
                if (base[49]) obits |= 0x0002000000000000;
                if (base[50]) obits |= 0x0004000000000000;
                if (base[51]) obits |= 0x0008000000000000;
                if (base[52]) obits |= 0x0010000000000000;
                if (base[53]) obits |= 0x0020000000000000;
                if (base[54]) obits |= 0x0040000000000000;
                if (base[55]) obits |= 0x0080000000000000;
                if (base[56]) obits |= 0x0100000000000000;
                if (base[57]) obits |= 0x0200000000000000;
                if (base[58]) obits |= 0x0400000000000000;
                if (base[59]) obits |= 0x0800000000000000;
                if (base[60]) obits |= 0x1000000000000000;
                if (base[61]) obits |= 0x2000000000000000;
                if (base[62]) obits |= 0x4000000000000000;
                if (base[63]) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (source[jbase + j]) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }